

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd2jpcommon.c
# Opt level: O0

void convert_pos(char *buff,char *pos,char *pos_group1,char *pos_group2,char *pos_group3)

{
  int iVar1;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *in_R8;
  int i;
  int local_2c;
  
  local_2c = 0;
  while( true ) {
    if (njd2jpcommon_pos_list[local_2c] == (char *)0x0) {
      fprintf(_stderr,
              "WARNING: convert_pos() in njd2jpcommon.c: %s %s %s %s are not appropriate POS.\n",
              in_RSI,in_RDX,in_RCX,in_R8);
      strcpy(in_RDI,njd2jpcommon_pos_list[4]);
      return;
    }
    iVar1 = strcmp(njd2jpcommon_pos_list[local_2c],in_RSI);
    if ((((iVar1 == 0) && (iVar1 = strcmp(njd2jpcommon_pos_list[local_2c + 1],in_RDX), iVar1 == 0))
        && (iVar1 = strcmp(njd2jpcommon_pos_list[local_2c + 2],in_RCX), iVar1 == 0)) &&
       (iVar1 = strcmp(njd2jpcommon_pos_list[local_2c + 3],in_R8), iVar1 == 0)) break;
    local_2c = local_2c + 5;
  }
  strcpy(in_RDI,njd2jpcommon_pos_list[local_2c + 4]);
  return;
}

Assistant:

static void convert_pos(char *buff, const char *pos, const char *pos_group1, const char *pos_group2,
                        const char *pos_group3)
{
   int i;

   for (i = 0; njd2jpcommon_pos_list[i] != NULL; i += 5) {
      if (strcmp(njd2jpcommon_pos_list[i], pos) == 0 &&
          strcmp(njd2jpcommon_pos_list[i + 1], pos_group1) == 0 &&
          strcmp(njd2jpcommon_pos_list[i + 2], pos_group2) == 0 &&
          strcmp(njd2jpcommon_pos_list[i + 3], pos_group3) == 0) {
         strcpy(buff, njd2jpcommon_pos_list[i + 4]);
         return;
      }
   }
   fprintf(stderr,
           "WARNING: convert_pos() in njd2jpcommon.c: %s %s %s %s are not appropriate POS.\n", pos,
           pos_group1, pos_group2, pos_group3);
   strcpy(buff, njd2jpcommon_pos_list[4]);
}